

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O0

ngx_int_t ngx_chain_add_copy(ngx_pool_t *pool,ngx_chain_t **chain,ngx_chain_t *in)

{
  ngx_chain_t *pnVar1;
  ngx_chain_t **local_38;
  ngx_chain_t **ll;
  ngx_chain_t *cl;
  ngx_chain_t *in_local;
  ngx_chain_t **chain_local;
  ngx_pool_t *pool_local;
  
  local_38 = chain;
  for (ll = (ngx_chain_t **)*chain; cl = in, ll != (ngx_chain_t **)0x0; ll = (ngx_chain_t **)ll[1])
  {
    local_38 = ll + 1;
  }
  while( true ) {
    if (cl == (ngx_chain_t *)0x0) {
      *local_38 = (ngx_chain_t *)0x0;
      return 0;
    }
    pnVar1 = ngx_alloc_chain_link(pool);
    if (pnVar1 == (ngx_chain_t *)0x0) break;
    pnVar1->buf = cl->buf;
    *local_38 = pnVar1;
    local_38 = &pnVar1->next;
    cl = cl->next;
  }
  return -1;
}

Assistant:

ngx_int_t
ngx_chain_add_copy(ngx_pool_t *pool, ngx_chain_t **chain, ngx_chain_t *in)
{
    ngx_chain_t  *cl, **ll;

    ll = chain;

    for (cl = *chain; cl; cl = cl->next) {
        ll = &cl->next;
    }

    while (in) {
        cl = ngx_alloc_chain_link(pool);
        if (cl == NULL) {
            return NGX_ERROR;
        }

        cl->buf = in->buf;
        *ll = cl;
        ll = &cl->next;
        in = in->next;
    }

    *ll = NULL;

    return NGX_OK;
}